

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,uint *args,uint *args_1,unsigned_long *args_2)

{
  Printer *this_00;
  size_t sVar1;
  uint x;
  unsigned_long x_00;
  long lVar2;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_00;
  string_view format_00;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->printer_;
  ToString<unsigned_int,void>(&local_90,(Formatter *)(ulong)*args,(uint)args);
  ToString<unsigned_int,void>(&local_70,(Formatter *)(ulong)*args_1,x);
  ToString<unsigned_long,void>(&local_50,(Formatter *)*args_2,x_00);
  sVar1 = strlen(format);
  args_00.len_ = 3;
  args_00.ptr_ = &local_90;
  format_00._M_str = format;
  format_00._M_len = sVar1;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,args_00,&this->vars_,format_00);
  lVar2 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }